

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::LessThanTest<unsigned_char,long>(void)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_17;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_16;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_15;
  int local_14 [3];
  
  local_14[2] = 3;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_15,local_14 + 2);
  if (2 < local_15.m_int) {
    local_14[1] = 4;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_16,local_14 + 1);
    if (local_16.m_int < 5) {
      local_14[0] = 6;
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_17,local_14);
      return local_17.m_int < 7;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanTest()
	{
		return
			(U)2 < SafeInt<T>(3) &&
			SafeInt<T>(4) < (U)5 &&
			SafeInt<T>(6) < SafeInt<U>(7);
	}